

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O0

void work_mgga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  long *in_RDI;
  long in_R9;
  double s_ave;
  double my_tau [2];
  double my_sigma [3];
  double my_rho [2];
  double dens;
  size_t ip;
  double *in_stack_00001ce8;
  double *in_stack_00001cf0;
  double *in_stack_00001cf8;
  double *in_stack_00001d00;
  size_t in_stack_00001d08;
  xc_func_type *in_stack_00001d10;
  xc_mgga_out_params *in_stack_00001d20;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_40;
  ulong local_38;
  long local_30;
  long local_20;
  long local_18;
  ulong local_10;
  long *local_8;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_58,0,0x10);
  memset(&local_78,0,0x18);
  memset(&local_88,0,0x10);
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    if ((int)local_8[1] == 2) {
      local_98 = *(double *)(local_18 + local_38 * (long)(int)local_8[9] * 8) +
                 *(double *)(local_18 + 8 + local_38 * (long)(int)local_8[9] * 8);
    }
    else {
      local_98 = *(double *)(local_18 + local_38 * (long)(int)local_8[9] * 8);
    }
    local_40 = local_98;
    if ((double)local_8[0x30] <= local_98) {
      if (*(double *)(local_18 + local_38 * (long)(int)local_8[9] * 8) <= (double)local_8[0x30]) {
        local_a0 = (double)local_8[0x30];
      }
      else {
        local_a0 = *(double *)(local_18 + local_38 * (long)(int)local_8[9] * 8);
      }
      local_58 = local_a0;
      if (*(double *)(local_20 + local_38 * (long)*(int *)((long)local_8 + 0x4c) * 8) <=
          (double)local_8[0x32] * (double)local_8[0x32]) {
        local_a8 = (double)local_8[0x32] * (double)local_8[0x32];
      }
      else {
        local_a8 = *(double *)(local_20 + local_38 * (long)*(int *)((long)local_8 + 0x4c) * 8);
      }
      local_78 = local_a8;
      if ((*(uint *)(*local_8 + 0x40) & 0x10000) != 0) {
        if (*(double *)(local_30 + local_38 * (long)*(int *)((long)local_8 + 0x54) * 8) <=
            (double)local_8[0x33]) {
          local_b0 = (double)local_8[0x33];
        }
        else {
          local_b0 = *(double *)(local_30 + local_38 * (long)*(int *)((long)local_8 + 0x54) * 8);
        }
        local_88 = local_b0;
        if ((*(uint *)(*local_8 + 0x40) & 0x20000) != 0) {
          if (local_a0 * 8.0 * local_b0 <= local_a8) {
            local_b8 = local_a0 * 8.0 * local_b0;
          }
          else {
            local_b8 = local_a8;
          }
          local_78 = local_b8;
        }
      }
      if ((int)local_8[1] == 2) {
        if (*(double *)(local_18 + 8 + local_38 * (long)(int)local_8[9] * 8) <=
            (double)local_8[0x30]) {
          local_c0 = (double)local_8[0x30];
        }
        else {
          local_c0 = *(double *)(local_18 + 8 + local_38 * (long)(int)local_8[9] * 8);
        }
        local_50 = local_c0;
        if (*(double *)(local_20 + 0x10 + local_38 * (long)*(int *)((long)local_8 + 0x4c) * 8) <=
            (double)local_8[0x32] * (double)local_8[0x32]) {
          local_c8 = (double)local_8[0x32] * (double)local_8[0x32];
        }
        else {
          local_c8 = *(double *)
                      (local_20 + 0x10 + local_38 * (long)*(int *)((long)local_8 + 0x4c) * 8);
        }
        local_68 = local_c8;
        if ((*(uint *)(*local_8 + 0x40) & 0x10000) != 0) {
          if (*(double *)(local_30 + 8 + local_38 * (long)*(int *)((long)local_8 + 0x54) * 8) <=
              (double)local_8[0x33]) {
            local_d0 = (double)local_8[0x33];
          }
          else {
            local_d0 = *(double *)
                        (local_30 + 8 + local_38 * (long)*(int *)((long)local_8 + 0x54) * 8);
          }
          local_80 = local_d0;
          if ((*(uint *)(*local_8 + 0x40) & 0x20000) != 0) {
            if (local_c0 * 8.0 * local_d0 <= local_c8) {
              local_d8 = local_c0 * 8.0 * local_d0;
            }
            else {
              local_d8 = local_c8;
            }
            local_68 = local_d8;
          }
        }
        local_e0 = *(double *)(local_20 + 8 + local_38 * (long)*(int *)((long)local_8 + 0x4c) * 8);
        local_e8 = (local_78 + local_68) * 0.5;
        if (local_e0 < -local_e8) {
          local_e0 = -local_e8;
        }
        if (local_e0 <= local_e8) {
          local_e8 = local_e0;
        }
        local_70 = local_e8;
      }
      func_vxc_pol(in_stack_00001d10,in_stack_00001d08,in_stack_00001d00,in_stack_00001cf8,
                   in_stack_00001cf0,in_stack_00001ce8,in_stack_00001d20);
    }
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}